

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  int iVar1;
  int local_94;
  int local_90;
  int i;
  int est;
  int best_filter_val;
  int best_filter;
  int filter_type;
  int zlen;
  int j;
  char *line_buffer;
  uchar *zlib;
  uchar *filt;
  uchar *o;
  uchar *out;
  uchar sig [8];
  int ctype [5];
  int force_filter;
  int *out_len_local;
  int n_local;
  int y_local;
  int x_local;
  int stride_bytes_local;
  uchar *pixels_local;
  
  ctype[3] = stbi_write_force_png_filter;
  sig[0] = 0xff;
  sig[1] = 0xff;
  sig[2] = 0xff;
  sig[3] = 0xff;
  sig[4] = '\0';
  sig[5] = '\0';
  sig[6] = '\0';
  sig[7] = '\0';
  out = (uchar *)0xa1a0a0d474e5089;
  y_local = stride_bytes;
  if (stride_bytes == 0) {
    y_local = x * n;
  }
  if (4 < stbi_write_force_png_filter) {
    ctype[3] = -1;
  }
  zlib = (uchar *)malloc((long)((x * n + 1) * y));
  if (zlib == (uchar *)0x0) {
    pixels_local = (uchar *)0x0;
  }
  else {
    _zlen = (char *)malloc((long)(x * n));
    if (_zlen == (char *)0x0) {
      free(zlib);
      pixels_local = (uchar *)0x0;
    }
    else {
      for (filter_type = 0; filter_type < y; filter_type = filter_type + 1) {
        if (ctype[3] < 0) {
          est = 0;
          i = 0x7fffffff;
          for (best_filter_val = 0; best_filter_val < 5; best_filter_val = best_filter_val + 1) {
            stbiw__encode_png_line(pixels,y_local,x,y,filter_type,n,best_filter_val,_zlen);
            local_90 = 0;
            for (local_94 = 0; local_94 < x * n; local_94 = local_94 + 1) {
              iVar1 = (int)_zlen[local_94];
              if (iVar1 < 1) {
                iVar1 = -iVar1;
              }
              local_90 = iVar1 + local_90;
            }
            if (local_90 < i) {
              i = local_90;
              est = best_filter_val;
            }
          }
          if (best_filter_val != est) {
            stbiw__encode_png_line(pixels,y_local,x,y,filter_type,n,est,_zlen);
            best_filter_val = est;
          }
        }
        else {
          best_filter_val._0_1_ = (uchar)ctype[3];
          stbiw__encode_png_line(pixels,y_local,x,y,filter_type,n,ctype[3],_zlen);
        }
        zlib[filter_type * (x * n + 1)] = (uchar)best_filter_val;
        memmove(zlib + (long)(filter_type * (x * n + 1)) + 1,_zlen,(long)(x * n));
      }
      free(_zlen);
      line_buffer = (char *)stbi_zlib_compress(zlib,y * (x * n + 1),&best_filter,
                                               stbi_write_png_compression_level);
      free(zlib);
      if (line_buffer == (char *)0x0) {
        pixels_local = (uchar *)0x0;
      }
      else {
        o = (uchar *)malloc((long)(best_filter + 0x39));
        if (o == (uchar *)0x0) {
          pixels_local = (uchar *)0x0;
        }
        else {
          *out_len = best_filter + 0x39;
          *(uchar **)o = out;
          o[8] = '\0';
          o[9] = '\0';
          o[10] = '\0';
          o[0xb] = '\r';
          o[0xc] = 'I';
          o[0xd] = 'H';
          o[0xe] = 'D';
          o[0xf] = 'R';
          o[0x10] = (uchar)((uint)x >> 0x18);
          o[0x11] = (uchar)((uint)x >> 0x10);
          o[0x12] = (uchar)((uint)x >> 8);
          o[0x13] = (uchar)x;
          o[0x14] = (uchar)((uint)y >> 0x18);
          o[0x15] = (uchar)((uint)y >> 0x10);
          o[0x16] = (uchar)((uint)y >> 8);
          o[0x17] = (uchar)y;
          o[0x18] = '\b';
          o[0x19] = (uchar)ctype[(long)n + -2];
          o[0x1a] = '\0';
          o[0x1b] = '\0';
          filt = o + 0x1d;
          o[0x1c] = '\0';
          stbiw__wpcrc(&filt,0xd);
          *filt = (uchar)((uint)best_filter >> 0x18);
          filt[1] = (uchar)((uint)best_filter >> 0x10);
          filt[2] = (uchar)((uint)best_filter >> 8);
          filt[3] = (uchar)best_filter;
          filt[4] = 'I';
          filt[5] = 'D';
          filt[6] = 'A';
          filt[7] = 'T';
          filt = filt + 8;
          memmove(filt,line_buffer,(long)best_filter);
          filt = filt + best_filter;
          free(line_buffer);
          stbiw__wpcrc(&filt,best_filter);
          *filt = '\0';
          filt[1] = '\0';
          filt[2] = '\0';
          filt[3] = '\0';
          filt[4] = 'I';
          filt[5] = 'E';
          filt[6] = 'N';
          filt[7] = 'D';
          filt = filt + 8;
          stbiw__wpcrc(&filt,0);
          if (filt != o + *out_len) {
            __assert_fail("o == out + *out_len",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/stb/stb_image_write.h"
                          ,0x44e,
                          "unsigned char *stbi_write_png_to_mem(unsigned char *, int, int, int, int, int *)"
                         );
          }
          pixels_local = o;
        }
      }
    }
  }
  return pixels_local;
}

Assistant:

unsigned char *stbi_write_png_to_mem(unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len)
{
   int force_filter = stbi_write_force_png_filter;
   int ctype[5] = { -1, 0, 4, 2, 6 };
   unsigned char sig[8] = { 137,80,78,71,13,10,26,10 };
   unsigned char *out,*o, *filt, *zlib;
   signed char *line_buffer;
   int j,zlen;

   if (stride_bytes == 0)
      stride_bytes = x * n;

   if (force_filter >= 5) {
      force_filter = -1;
   }

   filt = (unsigned char *) STBIW_MALLOC((x*n+1) * y); if (!filt) return 0;
   line_buffer = (signed char *) STBIW_MALLOC(x * n); if (!line_buffer) { STBIW_FREE(filt); return 0; }
   for (j=0; j < y; ++j) {
      int filter_type;
      if (force_filter > -1) {
         filter_type = force_filter;
         stbiw__encode_png_line(pixels, stride_bytes, x, y, j, n, force_filter, line_buffer);
      } else { // Estimate the best filter by running through all of them:
         int best_filter = 0, best_filter_val = 0x7fffffff, est, i;
         for (filter_type = 0; filter_type < 5; filter_type++) {
            stbiw__encode_png_line(pixels, stride_bytes, x, y, j, n, filter_type, line_buffer);

            // Estimate the entropy of the line using this filter; the less, the better.
            est = 0;
            for (i = 0; i < x*n; ++i) {
               est += abs((signed char) line_buffer[i]);
            }
            if (est < best_filter_val) {
               best_filter_val = est;
               best_filter = filter_type;
            }
         }
         if (filter_type != best_filter) {  // If the last iteration already got us the best filter, don't redo it
            stbiw__encode_png_line(pixels, stride_bytes, x, y, j, n, best_filter, line_buffer);
            filter_type = best_filter;
         }
      }
      // when we get here, filter_type contains the filter type, and line_buffer contains the data
      filt[j*(x*n+1)] = (unsigned char) filter_type;
      STBIW_MEMMOVE(filt+j*(x*n+1)+1, line_buffer, x*n);
   }
   STBIW_FREE(line_buffer);
   zlib = stbi_zlib_compress(filt, y*( x*n+1), &zlen, stbi_write_png_compression_level);
   STBIW_FREE(filt);
   if (!zlib) return 0;

   // each tag requires 12 bytes of overhead
   out = (unsigned char *) STBIW_MALLOC(8 + 12+13 + 12+zlen + 12);
   if (!out) return 0;
   *out_len = 8 + 12+13 + 12+zlen + 12;

   o=out;
   STBIW_MEMMOVE(o,sig,8); o+= 8;
   stbiw__wp32(o, 13); // header length
   stbiw__wptag(o, "IHDR");
   stbiw__wp32(o, x);
   stbiw__wp32(o, y);
   *o++ = 8;
   *o++ = STBIW_UCHAR(ctype[n]);
   *o++ = 0;
   *o++ = 0;
   *o++ = 0;
   stbiw__wpcrc(&o,13);

   stbiw__wp32(o, zlen);
   stbiw__wptag(o, "IDAT");
   STBIW_MEMMOVE(o, zlib, zlen);
   o += zlen;
   STBIW_FREE(zlib);
   stbiw__wpcrc(&o, zlen);

   stbiw__wp32(o,0);
   stbiw__wptag(o, "IEND");
   stbiw__wpcrc(&o,0);

   STBIW_ASSERT(o == out + *out_len);

   return out;
}